

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void I210ToARGBRow_AVX2(uint16_t *y_buf,uint16_t *u_buf,uint16_t *v_buf,uint8_t *dst_argb,
                       YuvConstants *yuvconstants,int width)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  bool bVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  long lVar13;
  int iVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 in_ZMM5 [64];
  int width_local;
  
  auVar3 = *(undefined1 (*) [32])yuvconstants->kUVToB;
  auVar4 = *(undefined1 (*) [32])yuvconstants->kUVToG;
  auVar5 = *(undefined1 (*) [32])yuvconstants->kUVToR;
  auVar6 = *(undefined1 (*) [32])yuvconstants->kUVBiasB;
  auVar7 = *(undefined1 (*) [32])yuvconstants->kUVBiasG;
  auVar8 = *(undefined1 (*) [32])yuvconstants->kUVBiasR;
  auVar9 = *(undefined1 (*) [32])yuvconstants->kYToRgb;
  lVar13 = (long)v_buf - (long)u_buf;
  auVar11 = vpcmpeqb_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
  do {
    auVar2 = *(undefined1 (*) [16])u_buf;
    pauVar1 = (undefined1 (*) [16])((long)u_buf + lVar13);
    u_buf = (uint16_t *)((long)u_buf + 0x10);
    auVar15 = vpermq_avx2(ZEXT1632(auVar2),0xd8);
    auVar16 = vpermq_avx2(ZEXT1632(*pauVar1),0xd8);
    auVar15 = vpunpcklwd_avx2(auVar15,auVar16);
    auVar15 = vpsraw_avx2(auVar15,2);
    auVar15 = vpackuswb_avx2(auVar15,auVar15);
    auVar17 = vpunpcklwd_avx2(auVar15,auVar15);
    auVar18 = vpsllw_avx2(*(undefined1 (*) [32])y_buf,6);
    y_buf = (uint16_t *)((long)y_buf + 0x20);
    auVar15 = vpmaddubsw_avx2(auVar17,auVar5);
    auVar16 = vpmaddubsw_avx2(auVar17,auVar4);
    auVar17 = vpmaddubsw_avx2(auVar17,auVar3);
    auVar12 = vpsubw_avx2(auVar8,auVar15);
    auVar16 = vpsubw_avx2(auVar7,auVar16);
    auVar15 = vpsubw_avx2(auVar6,auVar17);
    auVar17 = vpmulhuw_avx2(auVar9,auVar18);
    auVar15 = vpaddsw_avx2(auVar15,auVar17);
    auVar16 = vpaddsw_avx2(auVar16,auVar17);
    auVar17 = vpaddsw_avx2(auVar12,auVar17);
    auVar15 = vpsraw_avx2(auVar15,6);
    auVar16 = vpsraw_avx2(auVar16,6);
    auVar17 = vpsraw_avx2(auVar17,6);
    auVar15 = vpackuswb_avx2(auVar15,auVar15);
    auVar16 = vpackuswb_avx2(auVar16,auVar16);
    auVar17 = vpackuswb_avx2(auVar17,auVar17);
    auVar15 = vpunpcklbw_avx2(auVar15,auVar16);
    auVar12 = vpermq_avx2(auVar15,0xd8);
    auVar15 = vpunpcklbw_avx2(auVar17,auVar11);
    auVar15 = vpermq_avx2(auVar15,0xd8);
    auVar16 = vpunpcklwd_avx2(auVar12,auVar15);
    auVar15 = vpunpckhwd_avx2(auVar12,auVar15);
    *(undefined1 (*) [32])dst_argb = auVar16;
    *(undefined1 (*) [32])((long)dst_argb + 0x20) = auVar15;
    dst_argb = (uint8_t *)((long)dst_argb + 0x40);
    iVar14 = width + -0x10;
    bVar10 = 0xf < width;
    width = iVar14;
  } while (iVar14 != 0 && bVar10);
  return;
}

Assistant:

void OMITFP I210ToARGBRow_AVX2(const uint16_t* y_buf,
                               const uint16_t* u_buf,
                               const uint16_t* v_buf,
                               uint8_t* dst_argb,
                               const struct YuvConstants* yuvconstants,
                               int width) {
  asm volatile (
    YUVTORGB_SETUP_AVX2(yuvconstants)
      "sub         %[u_buf],%[v_buf]             \n"
      "vpcmpeqb    %%ymm5,%%ymm5,%%ymm5          \n"

    LABELALIGN
      "1:                                        \n"
    READYUV210_AVX2
    YUVTORGB_AVX2(yuvconstants)
    STOREARGB_AVX2
      "sub         $0x10,%[width]                \n"
      "jg          1b                            \n"

      "vzeroupper                                \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [u_buf]"+r"(u_buf),    // %[u_buf]
    [v_buf]"+r"(v_buf),    // %[v_buf]
    [dst_argb]"+r"(dst_argb),  // %[dst_argb]
    [width]"+rm"(width)    // %[width]
  : [yuvconstants]"r"(yuvconstants)  // %[yuvconstants]
  : "memory", "cc", YUVTORGB_REGS_AVX2
    "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5"
  );
}